

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

void __thiscall tcmalloc::PageHeap::PageHeap(PageHeap *this,Length smallest_span_size)

{
  LogItem b;
  LogItem c;
  LogItem d;
  LogItem a;
  SpanList *local_90;
  uint local_6c;
  undefined1 auStack_68 [4];
  int i;
  anon_union_8_4_e5b1a622_for_u_ aStack_60;
  LogItem local_58;
  LogItem local_48;
  LogItem local_38 [2];
  Length local_18;
  Length smallest_span_size_local;
  PageHeap *this_local;
  
  this->smallest_span_size_ = smallest_span_size;
  local_18 = smallest_span_size;
  smallest_span_size_local = (Length)this;
  SpinLock::SpinLock(&this->lock_);
  PackedCache<35>::PackedCache(&this->pagemap_cache_);
  TCMalloc_PageMap2<35>::TCMalloc_PageMap2(&this->pagemap_,MetaDataAlloc);
  std::
  set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
  ::set(&this->large_normal_);
  std::
  set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
  ::set(&this->large_returned_);
  local_90 = this->free_;
  do {
    SpanList::SpanList(local_90);
    local_90 = local_90 + 1;
  } while (local_90 != (SpanList *)&this->stats_);
  Stats::Stats(&this->stats_);
  this->scavenge_counter_ = 0;
  this->release_index_ = 0x80;
  this->aggressive_decommit_ = false;
  if ((this->smallest_span_size_ & this->smallest_span_size_ - 1) != 0) {
    LogItem::LogItem(local_38,"(smallest_span_size_ & (smallest_span_size_-1)) == 0");
    LogItem::LogItem(&local_48);
    LogItem::LogItem(&local_58);
    LogItem::LogItem((LogItem *)auStack_68);
    a._4_4_ = 0;
    a.tag_ = local_38[0].tag_;
    b.u_.str = local_48.u_.str;
    b.tag_ = local_48.tag_;
    b._4_4_ = local_48._4_4_;
    c.u_.str = local_58.u_.str;
    c.tag_ = local_58.tag_;
    c._4_4_ = local_58._4_4_;
    d.u_.str = aStack_60.str;
    d.tag_ = (Tag)auStack_68;
    d._4_4_ = i;
    a.u_.str = local_38[0].u_.str;
    Log(kCrash,
        "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc",
        0x5c,a,b,c,d);
    do {
    } while( true );
  }
  for (local_6c = 0; local_6c < 0x80; local_6c = local_6c + 1) {
    DLL_Init(&this->free_[(int)local_6c].normal);
    DLL_Init(&this->free_[(int)local_6c].returned);
  }
  return;
}

Assistant:

PageHeap::PageHeap(Length smallest_span_size)
    : smallest_span_size_(smallest_span_size),
      pagemap_(MetaDataAlloc),
      scavenge_counter_(0),
      // Start scavenging at kMaxPages list
      release_index_(kMaxPages),
      aggressive_decommit_(false) {
  static_assert(kClassSizesMax <= (1 << PageMapCache::kValuebits));
  // smallest_span_size needs to be power of 2.
  CHECK_CONDITION((smallest_span_size_ & (smallest_span_size_-1)) == 0);
  for (int i = 0; i < kMaxPages; i++) {
    DLL_Init(&free_[i].normal);
    DLL_Init(&free_[i].returned);
  }
}